

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::DescriptorNode::GetPubkey
          (Pubkey *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  DescriptorKeyReference *this_00;
  undefined1 local_2b0 [8];
  DescriptorKeyReference ref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  DescriptorNode *this_local;
  
  this_00 = (DescriptorKeyReference *)__return_storage_ptr__;
  ref.argument_.field_2._8_8_ = array_argument;
  GetKeyReferences((DescriptorKeyReference *)local_2b0,this,array_argument);
  DescriptorKeyReference::GetPubkey((Pubkey *)this_00,(DescriptorKeyReference *)local_2b0);
  DescriptorKeyReference::~DescriptorKeyReference(this_00);
  return __return_storage_ptr__;
}

Assistant:

Pubkey DescriptorNode::GetPubkey(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference ref = GetKeyReferences(array_argument);
  return ref.GetPubkey();
}